

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O0

SQRESULT sqstd_createfile(HSQUIRRELVM v,SQFILE file,SQBool own)

{
  SQInteger idx;
  SQRESULT SVar1;
  HSQUIRRELVM in_RDX;
  HSQUIRRELVM in_RSI;
  HSQUIRRELVM in_RDI;
  SQInteger top;
  SQInteger in_stack_00000020;
  HSQUIRRELVM in_stack_00000028;
  
  idx = sq_gettop(in_RDI);
  sq_pushregistrytable((HSQUIRRELVM)0x14c62b);
  sq_pushstring((HSQUIRRELVM)file,(SQChar *)own,top);
  SVar1 = sq_get(in_RSI,(SQInteger)in_RDX);
  if (-1 < SVar1) {
    sq_remove(in_RDX,idx);
    sq_pushroottable((HSQUIRRELVM)0x14c679);
    sq_pushuserpointer((HSQUIRRELVM)file,(SQUserPointer)own);
    if (in_RDX == (HSQUIRRELVM)0x0) {
      sq_pushnull((HSQUIRRELVM)0x14c6ab);
    }
    else {
      sq_pushinteger((HSQUIRRELVM)file,own);
    }
    SVar1 = sq_call(in_stack_00000028,in_stack_00000020,(SQBool)v,(SQBool)file);
    if (-1 < SVar1) {
      sq_remove(in_RDX,idx);
      return 0;
    }
  }
  sq_settop(in_RDX,idx);
  return -1;
}

Assistant:

SQRESULT sqstd_createfile(HSQUIRRELVM v, SQFILE file,SQBool own)
{
    SQInteger top = sq_gettop(v);
    sq_pushregistrytable(v);
    sq_pushstring(v,_SC("std_file"),-1);
    if(SQ_SUCCEEDED(sq_get(v,-2))) {
        sq_remove(v,-2); //removes the registry
        sq_pushroottable(v); // push the this
        sq_pushuserpointer(v,file); //file
        if(own){
            sq_pushinteger(v,1); //true
        }
        else{
            sq_pushnull(v); //false
        }
        if(SQ_SUCCEEDED( sq_call(v,3,SQTrue,SQFalse) )) {
            sq_remove(v,-2);
            return SQ_OK;
        }
    }
    sq_settop(v,top);
    return SQ_ERROR;
}